

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O3

int get_request(curl_socket_t sock,httprequest *req)

{
  byte bVar1;
  unsigned_short uVar2;
  int iVar3;
  ssize_t sVar4;
  char *pcVar5;
  uint *puVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  long *plVar12;
  int *piVar13;
  char *pcVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  byte *pbVar18;
  byte *pbVar19;
  char *pcVar20;
  size_t sVar21;
  int prot_minor;
  int prot_major;
  char *endp;
  char logbuf [456];
  uint local_218;
  uint local_214;
  ulong local_210;
  char *local_208;
  byte *local_200;
  char local_1f8 [456];
  
  uVar9 = req->offset;
  pcVar20 = "Request would overflow buffer, closing connection";
  if (0x249ee < uVar9) goto LAB_00106f0e;
  if (req->skip == 0) {
    sVar7 = 149999 - uVar9;
  }
  else {
    sVar7 = req->cl;
  }
  sVar4 = recv(sock,req->reqbuf + uVar9,sVar7,0);
  if (got_exit_signal != 0) {
    return -1;
  }
  if (sVar4 == 0) {
    logmsg("Connection closed by client");
LAB_00106328:
    req->reqbuf[req->offset] = '\0';
    storerequest(req->reqbuf,req->offset);
    return -1;
  }
  if (sVar4 < 0) {
    puVar6 = (uint *)__errno_location();
    uVar15 = *puVar6;
    if (uVar15 == 0xb) {
      return 0;
    }
    pcVar20 = strerror(uVar15);
    logmsg("recv() returned error: (%d) %s",(ulong)uVar15,pcVar20);
    goto LAB_00106328;
  }
  logmsg("Read %zd bytes",sVar4);
  sVar21 = sVar4 + req->offset;
  req->offset = sVar21;
  req->reqbuf[sVar21] = '\0';
  pcVar11 = req->reqbuf + req->checkindex;
  pcVar5 = strstr(pcVar11,end_of_headers);
  iVar3 = req->callcount;
  req->callcount = iVar3 + 1;
  pcVar14 = "";
  if (0 < iVar3) {
    pcVar14 = " [CONTINUED]";
  }
  logmsg("Process %d bytes request%s",req->offset,pcVar14);
  if (use_gopher == '\x01') {
    if (req->testno != -4) goto LAB_00106421;
    iVar3 = strncmp("/verifiedserver",pcVar11,0xf);
    if (iVar3 != 0) goto LAB_00106356;
    logmsg("Are-we-friendly question received");
    req->testno = -2;
LAB_0010657d:
    uVar15 = 1;
  }
  else {
    if (req->testno == -4) {
LAB_00106356:
      iVar3 = __isoc99_sscanf(pcVar11,"%255s %139999s HTTP/%d.%d",ProcessRequest_request,
                              &ProcessRequest_doc,&local_214,&local_218);
      uVar15 = local_218;
      if (iVar3 != 4) goto LAB_00106421;
      local_210 = (ulong)local_214;
      req->prot_version = local_218 + local_214 * 10;
      pcVar14 = strrchr(&ProcessRequest_doc,0x2f);
      local_208 = pcVar14;
      if (pcVar14 != (char *)0x0) {
        sVar7 = strlen(&ProcessRequest_doc);
        sVar8 = strlen(ProcessRequest_request);
        if (sVar8 + sVar7 < 400) {
          curl_msnprintf(local_1f8,0x1c8,"Got request: %s %s HTTP/%d.%d",ProcessRequest_request,
                         &ProcessRequest_doc,local_210,uVar15);
        }
        else {
          curl_msnprintf(local_1f8,0x1c8,"Got a *HUGE* request HTTP/%d.%d",local_210);
        }
        logmsg("%s",local_1f8);
        iVar3 = strncmp("/verifiedserver",pcVar14,0xf);
        if (iVar3 == 0) {
          lVar10 = -2;
          pcVar11 = "Are-we-friendly question received";
        }
        else {
          iVar3 = strncmp("/quit",pcVar14,5);
          if (iVar3 != 0) {
            do {
              pcVar14 = pcVar14 + 1;
              if (*pcVar14 == 0) break;
              iVar3 = Curl_isdigit((uint)(byte)*pcVar14);
            } while (iVar3 == 0);
            local_208 = pcVar14;
            uVar9 = strtol(pcVar14,&local_208,10);
            req->testno = uVar9;
            if (10000 < (long)uVar9) {
              req->partno = uVar9 % 10000;
              req->testno = uVar9 / 10000;
              uVar9 = uVar9 / 10000;
LAB_0010659e:
              curl_msnprintf(local_1f8,0x1c8,"Requested test number %ld part %ld",uVar9);
              logmsg("%s",local_1f8);
              goto LAB_001065ca;
            }
            req->partno = 0;
            if (uVar9 != 0) goto LAB_0010659e;
            logmsg("No test number");
            req->testno = -4;
            goto LAB_001065d8;
          }
          lVar10 = -3;
          pcVar11 = "Request-to-quit received";
        }
        logmsg(pcVar11);
        req->testno = lVar10;
        goto LAB_0010657d;
      }
LAB_001065ca:
      if (req->testno == -4) {
LAB_001065d8:
        iVar3 = __isoc99_sscanf(req,"CONNECT %139999s HTTP/%d.%d",&ProcessRequest_doc,&local_214);
        if (iVar3 == 3) {
          curl_msnprintf(local_1f8,0x1c8,"Received a CONNECT %s HTTP/%d.%d request",
                         &ProcessRequest_doc,(ulong)local_214,(ulong)local_218);
          logmsg("%s");
          req->connect_request = true;
          if (req->prot_version == 10) {
            req->open = false;
          }
          if (ProcessRequest_doc == '[') {
            pcVar14 = "Invalid CONNECT IPv6 address format";
            if (DAT_0010e781 == 0) {
              uVar9 = 0;
            }
            else {
              uVar9 = 0;
              pbVar19 = &DAT_0010e781;
              bVar1 = DAT_0010e781;
              do {
                iVar3 = Curl_isxdigit((uint)bVar1);
                if (((iVar3 == 0) && (bVar1 = *pbVar19, bVar1 != 0x2e)) && (bVar1 != 0x3a)) {
                  if (bVar1 == 0x5d) {
                    if (pbVar19[1] == 0x3a) {
                      pbVar19 = pbVar19 + 1;
                      goto LAB_00106727;
                    }
                    pcVar14 = "Invalid CONNECT IPv6 port format";
                    goto LAB_0010671d;
                  }
                  break;
                }
                uVar9 = strtoul((char *)pbVar19,(char **)&local_200,0x10);
                iVar3 = Curl_isxdigit((uint)*pbVar19);
                pbVar18 = local_200;
                if (iVar3 == 0) {
                  pbVar18 = pbVar19 + 1;
                }
                bVar1 = *pbVar18;
                pbVar19 = pbVar18;
              } while (bVar1 != 0);
              pcVar14 = "Invalid CONNECT IPv6 address format";
            }
LAB_0010671d:
            pbVar19 = (byte *)0x0;
            logmsg(pcVar14);
LAB_00106727:
            req->testno = uVar9;
          }
          else {
            pbVar19 = (byte *)strchr(&ProcessRequest_doc,0x3a);
          }
          if (((pbVar19 != (byte *)0x0) && (pbVar19[1] != 0)) &&
             (iVar3 = Curl_isdigit((uint)pbVar19[1]), iVar3 != 0)) {
            uVar9 = strtoul((char *)(pbVar19 + 1),(char **)0x0,10);
            if (uVar9 - 0x10000 < 0xffffffffffff0001) {
              logmsg("Invalid CONNECT port received");
            }
            else {
              uVar2 = curlx_ultous(uVar9);
              req->connect_port = uVar2;
            }
          }
          logmsg("Port number: %d, test case number: %ld",(ulong)req->connect_port,req->testno);
        }
        if (req->testno == -4) {
          pcVar14 = strrchr(&ProcessRequest_doc,0x2e);
          if (pcVar14 != (char *)0x0) {
            local_208 = pcVar14 + 1;
            uVar9 = strtol(local_208,&local_208,10);
            req->testno = uVar9;
            if ((long)uVar9 < 0x2711) {
              req->partno = 0;
            }
            else {
              req->partno = uVar9 % 10000;
              req->testno = uVar9 / 10000;
              logmsg("found test %d in requested host name",uVar9 / 10000);
              uVar9 = req->testno;
            }
            curl_msnprintf(local_1f8,0x1c8,"Requested test number %ld part %ld (from host name)",
                           uVar9);
            logmsg("%s",local_1f8);
            if (req->testno == 0) {
              logmsg("Did not find test number in PATH");
              req->testno = -1;
              goto LAB_001068ad;
            }
          }
          parse_servercmd(req);
        }
      }
    }
    else {
LAB_00106421:
      if ((2 < req->offset) && (req->testno == -4)) {
        logmsg("** Unusual request. Starts with %02x %02x %02x (%c%c%c)");
      }
    }
LAB_001068ad:
    if (pcVar5 != (char *)0x0) {
      logmsg("- request found to be complete (%d)",req->testno);
      if (req->testno == -4) {
        pcVar14 = strstr(pcVar11,"\nTestno: ");
        if (pcVar14 == (char *)0x0) {
          logmsg("No Testno: header");
        }
        else {
          lVar10 = strtol(pcVar14 + 9,(char **)0x0,10);
          req->testno = lVar10;
          logmsg("Found test number %d in Testno: header!",lVar10);
        }
      }
      parse_servercmd(req);
      if ((use_gopher == '\x01') && (pcVar14 = strrchr(pcVar11,0x2f), pcVar14 != (char *)0x0)) {
        do {
          pcVar14 = pcVar14 + 1;
          if (*pcVar14 == 0) break;
          iVar3 = Curl_isdigit((uint)(byte)*pcVar14);
        } while (iVar3 == 0);
        local_208 = pcVar14;
        uVar9 = strtol(pcVar14,&local_208,10);
        if ((long)uVar9 < 0x2711) {
          uVar17 = 0;
        }
        else {
          uVar17 = uVar9 % 10000;
          uVar9 = uVar9 / 10000;
        }
        req->testno = uVar9;
        req->partno = uVar17;
        curl_msnprintf(local_1f8,0x1c8,"Requested GOPHER test number %ld part %ld");
        logmsg("%s",local_1f8);
      }
      uVar15 = 1;
LAB_00106a17:
      if (got_exit_signal != 0) goto LAB_00106ee2;
      if ((req->cl != 0) ||
         (iVar3 = Curl_strncasecompare("Content-Length:",pcVar11,0xf), iVar3 == 0)) {
        iVar3 = Curl_strncasecompare("Transfer-Encoding: chunked",pcVar11,0x1a);
        if (iVar3 == 0) goto code_r0x00106a5e;
        pcVar11 = strstr(req->reqbuf,"\r\n0\r\n\r\n");
        if (pcVar11 != (char *)0x0) goto LAB_00106ee2;
        pcVar11 = strstr(req->reqbuf,"\r\n0\r\n");
        if (pcVar11 == (char *)0x0) {
          if ((already_recv_zeroed_chunk != '\x01') ||
             (pcVar11 = strstr(req->reqbuf,"\r\n\r\n"), pcVar11 == (char *)0x0)) goto LAB_00106cdc;
        }
        else {
          pcVar5 = strstr(req->reqbuf,"\r\n\r\n");
          do {
            pcVar14 = pcVar5;
            pcVar5 = strstr(pcVar14 + 4,"\r\n\r\n");
          } while (pcVar5 != (char *)0x0);
          if (pcVar14 <= pcVar11) {
            already_recv_zeroed_chunk = '\x01';
LAB_00106cdc:
            uVar15 = 0;
          }
        }
        goto LAB_00106ee2;
      }
      bVar1 = pcVar11[0xf];
      pcVar11 = pcVar11 + 0xf;
      while ((bVar1 != 0 && (iVar3 = Curl_isspace((uint)bVar1), iVar3 != 0))) {
        bVar1 = pcVar11[1];
        pcVar11 = pcVar11 + 1;
      }
      local_208 = pcVar11;
      piVar13 = __errno_location();
      *piVar13 = 0;
      local_210 = strtoul(pcVar11,&local_208,10);
      if (((pcVar11 == local_208) || (iVar3 = Curl_isspace((uint)(byte)*local_208), iVar3 == 0)) ||
         (*piVar13 == 0x22)) {
        logmsg("Found invalid Content-Length: (%s) in the request",pcVar11);
        req->open = false;
        goto LAB_00106ee2;
      }
      req->cl = local_210 - (long)req->skip;
      logmsg("Found Content-Length: %lu in the request");
      if (req->skip != 0) {
        logmsg("... but will abort after %zu bytes",req->cl);
      }
LAB_00106a74:
      if (((req->auth == false) &&
          (pcVar11 = strstr(req->reqbuf,"Authorization:"), pcVar11 != (char *)0x0)) &&
         (req->auth = true, req->auth_req == true)) {
        logmsg("Authorization header found, as required");
      }
      pcVar11 = strstr(req->reqbuf,"Authorization: Negotiate");
      if (pcVar11 == (char *)0x0) {
        if ((req->digest == false) &&
           (pcVar11 = strstr(req->reqbuf,"Authorization: Digest"), pcVar11 != (char *)0x0)) {
          sVar21 = req->partno + 1000;
          req->partno = sVar21;
          req->digest = true;
          pcVar11 = "Received Digest request, sending back data %ld";
        }
        else if (req->ntlm == false) {
          pcVar11 = strstr(req->reqbuf,"Authorization: NTLM TlRMTVNTUAAD");
          if (pcVar11 == (char *)0x0) {
            pcVar11 = strstr(req->reqbuf,"Authorization: NTLM TlRMTVNTUAAB");
            if (pcVar11 == (char *)0x0) goto LAB_00106c76;
            sVar21 = req->partno + 0x3e9;
            req->partno = sVar21;
            req->ntlm = true;
            pcVar11 = "Received NTLM type-1, sending back data %ld";
          }
          else {
            req->partno = req->partno + 0x3ea;
            req->ntlm = true;
            logmsg("Received NTLM type-3, sending back data %ld");
            sVar21 = req->cl;
            if (sVar21 == 0) goto LAB_00106dcd;
            pcVar11 = "  Expecting %zu POSTed bytes";
          }
        }
        else {
LAB_00106c76:
          lVar10 = req->partno;
          if ((lVar10 < 1000) ||
             (pcVar11 = strstr(req->reqbuf,"Authorization: Basic"), pcVar11 == (char *)0x0))
          goto LAB_00106dcd;
          sVar21 = lVar10 + 1;
          req->partno = sVar21;
          pcVar11 = "Received Basic request, sending back data %ld";
        }
        logmsg(pcVar11,sVar21);
      }
      else {
        logmsg("Negotiate: prev_testno: %d, prev_partno: %d",ProcessRequest_prev_testno,
               ProcessRequest_prev_partno);
        if (req->testno == ProcessRequest_prev_testno) {
          plVar12 = &ProcessRequest_prev_partno;
        }
        else {
          plVar12 = &req->partno;
          ProcessRequest_prev_testno = req->testno;
        }
        ProcessRequest_prev_partno = *plVar12 + 1;
        req->partno = ProcessRequest_prev_partno;
      }
LAB_00106dcd:
      pcVar11 = strstr(req->reqbuf,"Connection: close");
      if (pcVar11 == (char *)0x0) {
        if ((((((req->open & 1U) != 0) && (10 < req->prot_version)) &&
             (sVar21 = req->offset, sVar7 = strlen(end_of_headers),
             pcVar5 + sVar7 < req->reqbuf + sVar21)) && (req->cl == 0)) &&
           ((((req->reqbuf[0] == 'G' && (req->reqbuf[1] == 'E')) && (req->reqbuf[2] == 'T')) ||
            (iVar3 = strncmp(req->reqbuf,"HEAD",4), iVar3 == 0)))) {
          req->checkindex = (size_t)(pcVar5 + (sVar7 - (long)req));
        }
      }
      else {
        req->open = false;
      }
      if ((req->auth_req != true) || (req->auth != false)) {
        if ((req->upgrade == true) &&
           (pcVar11 = strstr(req->reqbuf,"Upgrade:"), pcVar11 != (char *)0x0)) {
          logmsg("Found Upgrade: in request and allows it");
          req->upgrade_request = true;
        }
        uVar9 = req->cl;
        if (uVar9 != 0) {
          sVar21 = req->offset;
          sVar7 = strlen(end_of_headers);
          uVar15 = (uint)(uVar9 <= (long)req + (sVar21 - (long)(pcVar5 + sVar7)));
        }
        goto LAB_00106ee2;
      }
      pcVar11 = "Return early due to auth requested by none provided";
      goto LAB_0010691b;
    }
    pcVar11 = "request not complete yet";
    uVar15 = 0;
LAB_0010691b:
    logmsg(pcVar11);
  }
LAB_00106ee2:
  req->done_processing = uVar15;
  if (got_exit_signal != 0) {
    return -1;
  }
  uVar9 = req->offset;
  if (uVar9 == 149999) {
LAB_00106f0e:
    logmsg(pcVar20);
    req->reqbuf[149999] = '\0';
    uVar15 = 0xffffffff;
  }
  else {
    if (149999 < uVar9) {
      pcVar20 = "Request buffer overflow, closing connection";
      goto LAB_00106f0e;
    }
    req->reqbuf[uVar9] = '\0';
    uVar16 = 1;
    uVar15 = 1;
    if (req->done_processing == 0) goto LAB_00106f33;
  }
  uVar16 = uVar15;
  storerequest(req->reqbuf,req->offset);
LAB_00106f33:
  return -(uint)(got_exit_signal != 0) | uVar16;
code_r0x00106a5e:
  pcVar14 = strchr(pcVar11,10);
  pcVar11 = pcVar14 + 1;
  if (pcVar14 == (char *)0x0) goto LAB_00106a74;
  goto LAB_00106a17;
}

Assistant:

static int get_request(curl_socket_t sock, struct httprequest *req)
{
  int fail = 0;
  char *reqbuf = req->reqbuf;
  ssize_t got = 0;
  int overflow = 0;

  if(req->offset >= REQBUFSIZ-1) {
    /* buffer is already full; do nothing */
    overflow = 1;
  }
  else {
    if(req->skip)
      /* we are instructed to not read the entire thing, so we make sure to
         only read what we're supposed to and NOT read the enire thing the
         client wants to send! */
      got = sread(sock, reqbuf + req->offset, req->cl);
    else
      got = sread(sock, reqbuf + req->offset, REQBUFSIZ-1 - req->offset);

    if(got_exit_signal)
      return -1;
    if(got == 0) {
      logmsg("Connection closed by client");
      fail = 1;
    }
    else if(got < 0) {
      int error = SOCKERRNO;
      if(EAGAIN == error || EWOULDBLOCK == error) {
        /* nothing to read at the moment */
        return 0;
      }
      logmsg("recv() returned error: (%d) %s", error, strerror(error));
      fail = 1;
    }
    if(fail) {
      /* dump the request received so far to the external file */
      reqbuf[req->offset] = '\0';
      storerequest(reqbuf, req->offset);
      return -1;
    }

    logmsg("Read %zd bytes", got);

    req->offset += (size_t)got;
    reqbuf[req->offset] = '\0';

    req->done_processing = ProcessRequest(req);
    if(got_exit_signal)
      return -1;
  }

  if(overflow || (req->offset == REQBUFSIZ-1 && got > 0)) {
    logmsg("Request would overflow buffer, closing connection");
    /* dump request received so far to external file anyway */
    reqbuf[REQBUFSIZ-1] = '\0';
    fail = 1;
  }
  else if(req->offset > REQBUFSIZ-1) {
    logmsg("Request buffer overflow, closing connection");
    /* dump request received so far to external file anyway */
    reqbuf[REQBUFSIZ-1] = '\0';
    fail = 1;
  }
  else
    reqbuf[req->offset] = '\0';

  /* at the end of a request dump it to an external file */
  if(fail || req->done_processing)
    storerequest(reqbuf, req->offset);
  if(got_exit_signal)
    return -1;

  return fail ? -1 : 1;
}